

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O0

Gia_Man_t * Gia_ManRetimeForwardOne(Gia_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  bool bVar5;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vCut;
  Gia_Man_t *pNew;
  Vec_Int_t *vObjClasses;
  Vec_Int_t *vFlopClasses;
  int *pnRegMoves_local;
  int *pnRegFixed_local;
  Gia_Man_t *p_local;
  
  vObjClasses = (Vec_Int_t *)0x0;
  pNew = (Gia_Man_t *)0x0;
  if (p->vFlopClasses != (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManObjNum(p);
    pNew = (Gia_Man_t *)Vec_IntAlloc(iVar1);
    for (local_4c = 0; iVar1 = Gia_ManObjNum(p), local_4c < iVar1; local_4c = local_4c + 1) {
      Vec_IntPush((Vec_Int_t *)pNew,-1);
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pGStack_48 = Gia_ManCi(p,iVar1 + local_4c);
        bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjId(p,pGStack_48);
      iVar2 = Vec_IntEntry(p->vFlopClasses,local_4c);
      Vec_IntWriteEntry((Vec_Int_t *)pNew,iVar1,iVar2);
      local_4c = local_4c + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    vObjClasses = Vec_IntAlloc(iVar1);
  }
  Gia_ManIncrementTravId(p);
  Gia_ManMarkAutonomous(p);
  Gia_ManIncrementTravId(p);
  *pnRegFixed = 0;
  local_4c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (local_4c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_48 = Gia_ManCi(p,iVar1 + local_4c);
      bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsTravIdPrevious(p,pGStack_48);
    if (iVar1 == 0) {
      *pnRegFixed = *pnRegFixed + 1;
    }
    else {
      Gia_ObjSetTravIdCurrent(p,pGStack_48);
    }
    local_4c = local_4c + 1;
  }
  *pnRegMoves = 0;
  local_4c = 0;
  do {
    bVar5 = false;
    if (local_4c < p->nObjs) {
      pGStack_48 = Gia_ManObj(p,local_4c);
      bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) {
      local_4c = 0;
      while( true ) {
        iVar1 = Gia_ManRegNum(p);
        bVar5 = false;
        if (local_4c < iVar1) {
          iVar1 = Gia_ManPiNum(p);
          pGStack_48 = Gia_ManCi(p,iVar1 + local_4c);
          bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        Gia_ObjSetTravIdCurrent(p,pGStack_48);
        local_4c = local_4c + 1;
      }
      p_00 = Vec_PtrAlloc(1000);
      Gia_ManIncrementTravId(p);
      local_4c = 0;
      while( true ) {
        bVar5 = false;
        if (local_4c < p->nObjs) {
          pGStack_48 = Gia_ManObj(p,local_4c);
          bVar5 = pGStack_48 != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar1 = Gia_ObjIsTravIdPrevious(p,pGStack_48);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(pGStack_48);
          if ((iVar1 != 0) || (iVar1 = Gia_ObjIsAnd(pGStack_48), iVar1 != 0)) {
            pGVar3 = Gia_ObjFanin0(pGStack_48);
            iVar1 = Gia_ObjIsTravIdPrevious(p,pGVar3);
            if (iVar1 != 0) {
              if (vObjClasses != (Vec_Int_t *)0x0) {
                iVar1 = Gia_ObjFaninId0(pGStack_48,local_4c);
                iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,iVar1);
                Vec_IntPush(vObjClasses,iVar1);
              }
              pGVar3 = Gia_ObjFanin0(pGStack_48);
              Vec_PtrPush(p_00,pGVar3);
              pGVar3 = Gia_ObjFanin0(pGStack_48);
              Gia_ObjSetTravIdCurrent(p,pGVar3);
            }
          }
          iVar1 = Gia_ObjIsAnd(pGStack_48);
          if (iVar1 != 0) {
            pGVar3 = Gia_ObjFanin1(pGStack_48);
            iVar1 = Gia_ObjIsTravIdPrevious(p,pGVar3);
            if (iVar1 != 0) {
              if (vObjClasses != (Vec_Int_t *)0x0) {
                iVar1 = Gia_ObjFaninId1(pGStack_48,local_4c);
                iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,iVar1);
                Vec_IntPush(vObjClasses,iVar1);
              }
              pGVar3 = Gia_ObjFanin1(pGStack_48);
              Vec_PtrPush(p_00,pGVar3);
              pGVar3 = Gia_ObjFanin1(pGStack_48);
              Gia_ObjSetTravIdCurrent(p,pGVar3);
            }
          }
        }
        local_4c = local_4c + 1;
      }
      if (vObjClasses != (Vec_Int_t *)0x0) {
        iVar1 = Vec_IntSize(vObjClasses);
        iVar2 = Vec_PtrSize(p_00);
        if (iVar1 != iVar2) {
          __assert_fail("vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRetime.c"
                        ,0xf6,"Gia_Man_t *Gia_ManRetimeForwardOne(Gia_Man_t *, int *, int *)");
        }
      }
      pGVar4 = Gia_ManRetimeDupForward(p,p_00);
      Vec_PtrFree(p_00);
      if (pNew != (Gia_Man_t *)0x0) {
        Vec_IntFree((Vec_Int_t *)pNew);
      }
      pGVar4->vFlopClasses = vObjClasses;
      return pGVar4;
    }
    iVar1 = Gia_ObjIsAnd(pGStack_48);
    if (iVar1 != 0) {
      pGVar3 = Gia_ObjFanin0(pGStack_48);
      iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin1(pGStack_48);
        iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
        if (iVar1 != 0) {
          if (pNew != (Gia_Man_t *)0x0) {
            iVar1 = Gia_ObjFaninId0(pGStack_48,local_4c);
            iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,iVar1);
            iVar2 = Gia_ObjFaninId1(pGStack_48,local_4c);
            iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,iVar2);
            if (iVar1 != iVar2) goto LAB_009e7017;
          }
          if (pNew != (Gia_Man_t *)0x0) {
            iVar1 = Gia_ObjId(p,pGStack_48);
            iVar2 = Gia_ObjFaninId0(pGStack_48,local_4c);
            iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,iVar2);
            Vec_IntWriteEntry((Vec_Int_t *)pNew,iVar1,iVar2);
          }
          Gia_ObjSetTravIdCurrent(p,pGStack_48);
          *pnRegMoves = *pnRegMoves + 1;
        }
      }
    }
LAB_009e7017:
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManRetimeForwardOne( Gia_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Vec_Int_t * vFlopClasses = NULL;
    Vec_Int_t * vObjClasses = NULL;
    Gia_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses )
    {
//        printf( "Performing retiming with register classes.\n" );
        vObjClasses = Vec_IntAlloc( Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Vec_IntPush( vObjClasses, -1 );
        Gia_ManForEachRo( p, pObj, i )
            Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(p->vFlopClasses, i) );
        vFlopClasses = Vec_IntAlloc( Gia_ManRegNum(p) );
    }
    // mark the retimable nodes
    Gia_ManIncrementTravId( p );
    Gia_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Gia_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            Gia_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vObjClasses && Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) != Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) )
                continue;
            if ( vObjClasses )
                Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Gia_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( (Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj)) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin0(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
        if ( Gia_ObjIsAnd(pObj) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin1(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    }
    assert( vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut) );
    // finally derive the new manager
    pNew = Gia_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    if ( vObjClasses )
    Vec_IntFree( vObjClasses );
    pNew->vFlopClasses = vFlopClasses;
    return pNew;
}